

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  int iVar1;
  GLFWbool GVar2;
  unsigned_long uVar3;
  _GLFWwindow *window;
  int *e;
  double dStack_f8;
  undefined1 auStack_f0 [192];
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  e = (int *)0x0;
  if (*(long *)(handle + 0x48) != 0) {
    return;
  }
  if (*(int *)(handle + 0xc) == 0) {
    return;
  }
  if (_glfw.x11.NET_FRAME_EXTENTS == 0) {
    return;
  }
  iVar1 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
  if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS != 0 && iVar1 == 0) {
    dStack_f8 = 0.5;
    sendEventToWM((_GLFWwindow *)handle,_glfw.x11.NET_REQUEST_FRAME_EXTENTS,0,0,0,0,(long)e);
    while (iVar1 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle),
          iVar1 == 0) {
      GVar2 = waitForX11Event(&dStack_f8);
      if (GVar2 == 0) {
        _glfwInputError(0x10008,
                        "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                       );
        return;
      }
    }
  }
  uVar3 = _glfwGetWindowPropertyX11
                    (*(Window *)(handle + 0x350),_glfw.x11.NET_FRAME_EXTENTS,6,
                     (uchar **)&stack0xfffffffffffffee8);
  if (uVar3 == 4) {
    if (left != (int *)0x0) {
      *left = *e;
    }
    if (top != (int *)0x0) {
      *top = e[4];
    }
    if (right != (int *)0x0) {
      *right = e[2];
    }
    if (bottom != (int *)0x0) {
      *bottom = e[6];
      goto LAB_00215a63;
    }
  }
  if (e == (int *)0x0) {
    return;
  }
LAB_00215a63:
  XFree();
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}